

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadDataCountSection(BinaryReader *this,Offset section_size)

{
  int iVar1;
  Result RVar2;
  char *format;
  uint32_t value;
  uint local_1c;
  
  iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa4])();
  if (iVar1 == 0) {
    RVar2 = ReadU32Leb128(this,&local_1c,"data count");
    if (RVar2.enum_ != Error) {
      iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa5])(this->delegate_,(ulong)local_1c);
      if (iVar1 == 0) {
        iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa6])();
        if (iVar1 == 0) {
          this->data_count_ = local_1c;
          return (Result)Ok;
        }
        format = "EndDataCountSection callback failed";
      }
      else {
        format = "OnDataCount callback failed";
      }
      PrintError(this,format);
    }
  }
  else {
    PrintError(this,"BeginDataCountSection callback failed");
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadDataCountSection(Offset section_size) {
  CALLBACK(BeginDataCountSection, section_size);
  Index data_count;
  CHECK_RESULT(ReadIndex(&data_count, "data count"));
  CALLBACK(OnDataCount, data_count);
  CALLBACK0(EndDataCountSection);
  data_count_ = data_count;
  return Result::Ok;
}